

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O3

Print * __thiscall amrex::Print::operator<<(Print *this,char **x)

{
  ostringstream *poVar1;
  char *__s;
  size_t sVar2;
  
  poVar1 = &this->ss;
  __s = *x;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar2);
  }
  return this;
}

Assistant:

Print& operator<< (const T& x) {
            ss << x;
            return *this;
        }